

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::ShaderAtomicOrCase::getInputs
          (ShaderAtomicOrCase *this,int numValues,int stride,void *inputs)

{
  Precision PVar1;
  int iVar2;
  deUint32 seed;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int max;
  ulong uVar9;
  Random rnd;
  
  seed = deStringHash((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
                      m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  PVar1 = (this->super_ShaderAtomicOpCase).m_precision;
  uVar8 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  max = 0x1f;
  if (PVar1 != PRECISION_HIGHP) {
    max = (uint)(PVar1 == PRECISION_MEDIUMP) * 8 + 7;
  }
  iVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar8) {
    uVar7 = (ulong)uVar8;
  }
  iVar3 = numValues / (int)uVar8;
  if (numValues / (int)uVar8 < 1) {
    iVar3 = iVar6;
  }
  for (iVar4 = 0; uVar9 = uVar7, iVar2 = iVar6, iVar4 != iVar3; iVar4 = iVar4 + 1) {
    while (uVar9 != 0) {
      iVar5 = de::Random::getInt(&rnd,0,max);
      *(int *)((long)inputs + (long)iVar2) = 1 << ((byte)iVar5 & 0x1f);
      uVar9 = uVar9 - 1;
      iVar2 = iVar2 + stride;
    }
    iVar6 = iVar6 + uVar8 * stride;
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random		rnd				(deStringHash(getName()));
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int groupOffset = groupNdx*workGroupSize;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
				*(deUint32*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = 1u<<rnd.getInt(0, numBits-1);
		}
	}